

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O2

void __thiscall tlx::SpacingLogger::~SpacingLogger(SpacingLogger *this)

{
  undefined *puVar1;
  string asStack_38 [32];
  
  std::operator<<((ostream *)&this->oss_,'\n');
  puVar1 = s_logger_output_hook;
  std::__cxx11::stringbuf::str();
  (**(code **)(*(long *)puVar1 + 0x10))(puVar1,asStack_38);
  std::__cxx11::string::~string(asStack_38);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->oss_);
  return;
}

Assistant:

SpacingLogger::~SpacingLogger() {
    oss_ << '\n';
    (*s_logger_output_hook).append_log_line(oss_.str());
}